

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.cpp
# Opt level: O0

int __thiscall booster::streambuf::overflow(streambuf *this,int c)

{
  int iVar1;
  size_type __new_size;
  size_type sVar2;
  reference pvVar3;
  long lVar4;
  undefined1 *puVar5;
  io_device *piVar6;
  undefined8 uVar7;
  undefined4 extraout_var;
  int in_ESI;
  value_type_conflict1 *in_RDI;
  size_t res;
  streamsize real_size;
  streamsize n;
  streambuf *in_stack_ffffffffffffff98;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  int iVar8;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  long local_28;
  
  __new_size = std::streambuf::pptr();
  sVar2 = std::streambuf::pbase();
  if (__new_size == sVar2) {
    std::vector<char,_std::allocator<char>_>::resize(in_stack_ffffffffffffffd0,__new_size,in_RDI);
    pvVar3 = std::vector<char,_std::allocator<char>_>::front(in_stack_ffffffffffffffa0);
    std::vector<char,_std::allocator<char>_>::front(in_stack_ffffffffffffffa0);
    std::streambuf::setp(in_RDI,pvVar3);
    if (in_ESI != -1) {
      std::streambuf::sputc((char)in_RDI);
    }
  }
  else {
    local_28 = std::streambuf::pptr();
    iVar8 = (int)in_RDI;
    lVar4 = std::streambuf::pbase();
    local_28 = local_28 - lVar4;
    if (in_ESI != -1) {
      puVar5 = (undefined1 *)std::streambuf::pptr();
      *puVar5 = (char)in_ESI;
      local_28 = local_28 + 1;
    }
    if (0 < local_28) {
      piVar6 = device(in_stack_ffffffffffffff98);
      uVar7 = std::streambuf::pbase();
      iVar1 = (*piVar6->_vptr_io_device[1])(piVar6,uVar7,local_28);
      if (CONCAT44(extraout_var,iVar1) != local_28) {
        std::streambuf::pbump(iVar8);
        return -1;
      }
    }
    std::streambuf::pbump(iVar8);
  }
  return 0;
}

Assistant:

int streambuf::overflow(int c)
	{
		if(pptr()==pbase()) {
			buffer_out_.resize(buffer_size_+1,0);
			setp(&buffer_out_.front(),&buffer_out_.front()+buffer_size_);
			if(c!=EOF) {
				sputc(c);
			}
			return 0;
		}
		
		std::streamsize n=pptr() - pbase();
		std::streamsize real_size = n;

		if(c!=EOF) {
			*pptr()=c;
			real_size++;
		}
		if(real_size > 0) {
			size_t res = device().write(pbase(),real_size);
			if(std::streamsize(res) != real_size) {
				pbump(res);
				return EOF;
			}
		}
		pbump(-n);
		return 0;
	}